

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateCompileChunk(jx9_gen_state *pGen,sxi32 iFlags)

{
  sxu32 nKeywordID;
  int iVar1;
  sxi32 sVar2;
  bool bVar3;
  sxi32 local_24;
  sxu32 nKeyword;
  sxi32 rc;
  ProcLangConstruct xCons;
  sxi32 iFlags_local;
  jx9_gen_state *pGen_local;
  
  local_24 = 0;
  while( true ) {
    if (pGen->pEnd <= pGen->pIn) {
      return local_24;
    }
    _nKeyword = (ProcLangConstruct)0x0;
    if ((pGen->pIn->nType & 4) != 0) {
      nKeywordID = (sxu32)pGen->pIn->pUserData;
      _nKeyword = GenStateGetStatementHandler(nKeywordID);
      if ((_nKeyword == (ProcLangConstruct)0x0) &&
         (iVar1 = jx9IsLangConstruct(nKeywordID), iVar1 == 0)) {
        sVar2 = jx9GenCompileError(pGen,1,pGen->pIn->nLine,"Syntax error: Unexpected keyword \'%z\'"
                                   ,pGen->pIn);
        if (sVar2 == -10) {
          return -10;
        }
        _nKeyword = jx9ErrorRecover;
      }
    }
    if (_nKeyword == (ProcLangConstruct)0x0) {
      local_24 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      if (local_24 != -3) {
        jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
      }
    }
    else {
      local_24 = (*_nKeyword)(pGen);
    }
    if (local_24 == -10) break;
    while( true ) {
      bVar3 = false;
      if (pGen->pIn < pGen->pEnd) {
        bVar3 = (pGen->pIn->nType & 0x40000) != 0;
      }
      if (!bVar3) break;
      pGen->pIn = pGen->pIn + 1;
    }
    if ((iFlags & 1U) != 0) {
      return local_24;
    }
  }
  return -10;
}

Assistant:

static sxi32 GenStateCompileChunk(
	jx9_gen_state *pGen, /* Code generator state */
	sxi32 iFlags             /* Compile flags */
	)
{
	ProcLangConstruct xCons;
	sxi32 rc;
	rc = SXRET_OK; /* Prevent compiler warning */
	for(;;){
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		xCons = 0;
		if( pGen->pIn->nType & JX9_TK_KEYWORD ){
			sxu32 nKeyword = (sxu32)SX_PTR_TO_INT(pGen->pIn->pUserData);
			/* Try to extract a language construct handler */
			xCons = GenStateGetStatementHandler(nKeyword);
			if( xCons == 0 && !jx9IsLangConstruct(nKeyword) ){
				rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine,
					"Syntax error: Unexpected keyword '%z'",
					&pGen->pIn->sData);
				if( rc == SXERR_ABORT ){
					break;
				}
				/* Synchronize with the first semi-colon and avoid compiling
				 * this erroneous statement.
				 */
				xCons = jx9ErrorRecover;
			}
		}
		if( xCons == 0 ){
			/* Assume an expression an try to compile it */
			rc = jx9CompileExpr(&(*pGen), 0, 0);
			if(  rc != SXERR_EMPTY ){
				/* Pop l-value */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
			}
		}else{
			/* Go compile the sucker */
			rc = xCons(&(*pGen));
		}
		if( rc == SXERR_ABORT ){
			/* Request to abort compilation */
			break;
		}
		/* Ignore trailing semi-colons ';' */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) ){
			pGen->pIn++;
		}
		if( iFlags & JX9_COMPILE_SINGLE_STMT ){
			/* Compile a single statement and return */
			break;
		}
		/* LOOP ONE */
		/* LOOP TWO */
		/* LOOP THREE */
		/* LOOP FOUR */
	}
	/* Return compilation status */
	return rc;
}